

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SpecialInsert(Fts3Table *p,sqlite3_value *pVal)

{
  int iVar1;
  int iVar2;
  uchar *zLeft;
  int nVal;
  char *zVal;
  int rc;
  sqlite3_value *pVal_local;
  Fts3Table *p_local;
  
  zLeft = sqlite3_value_text(pVal);
  iVar1 = sqlite3_value_bytes(pVal);
  if (zLeft == (uchar *)0x0) {
    p_local._4_4_ = 7;
  }
  else {
    if ((iVar1 == 8) && (iVar2 = sqlite3_strnicmp((char *)zLeft,"optimize",8), iVar2 == 0)) {
      zVal._4_4_ = fts3DoOptimize(p,0);
    }
    else if ((iVar1 == 7) && (iVar2 = sqlite3_strnicmp((char *)zLeft,"rebuild",7), iVar2 == 0)) {
      zVal._4_4_ = fts3DoRebuild(p);
    }
    else if ((iVar1 == 0xf) &&
            (iVar2 = sqlite3_strnicmp((char *)zLeft,"integrity-check",0xf), iVar2 == 0)) {
      zVal._4_4_ = fts3DoIntegrityCheck(p);
    }
    else if ((iVar1 < 7) || (iVar2 = sqlite3_strnicmp((char *)zLeft,"merge=",6), iVar2 != 0)) {
      if ((iVar1 < 0xb) || (iVar1 = sqlite3_strnicmp((char *)zLeft,"automerge=",10), iVar1 != 0)) {
        zVal._4_4_ = 1;
      }
      else {
        zVal._4_4_ = fts3DoAutoincrmerge(p,(char *)(zLeft + 10));
      }
    }
    else {
      zVal._4_4_ = fts3DoIncrmerge(p,(char *)(zLeft + 6));
    }
    p_local._4_4_ = zVal._4_4_;
  }
  return p_local._4_4_;
}

Assistant:

static int fts3SpecialInsert(Fts3Table *p, sqlite3_value *pVal){
  int rc;                         /* Return Code */
  const char *zVal = (const char *)sqlite3_value_text(pVal);
  int nVal = sqlite3_value_bytes(pVal);

  if( !zVal ){
    return SQLITE_NOMEM;
  }else if( nVal==8 && 0==sqlite3_strnicmp(zVal, "optimize", 8) ){
    rc = fts3DoOptimize(p, 0);
  }else if( nVal==7 && 0==sqlite3_strnicmp(zVal, "rebuild", 7) ){
    rc = fts3DoRebuild(p);
  }else if( nVal==15 && 0==sqlite3_strnicmp(zVal, "integrity-check", 15) ){
    rc = fts3DoIntegrityCheck(p);
  }else if( nVal>6 && 0==sqlite3_strnicmp(zVal, "merge=", 6) ){
    rc = fts3DoIncrmerge(p, &zVal[6]);
  }else if( nVal>10 && 0==sqlite3_strnicmp(zVal, "automerge=", 10) ){
    rc = fts3DoAutoincrmerge(p, &zVal[10]);
#ifdef SQLITE_TEST
  }else if( nVal>9 && 0==sqlite3_strnicmp(zVal, "nodesize=", 9) ){
    p->nNodeSize = atoi(&zVal[9]);
    rc = SQLITE_OK;
  }else if( nVal>11 && 0==sqlite3_strnicmp(zVal, "maxpending=", 9) ){
    p->nMaxPendingData = atoi(&zVal[11]);
    rc = SQLITE_OK;
  }else if( nVal>21 && 0==sqlite3_strnicmp(zVal, "test-no-incr-doclist=", 21) ){
    p->bNoIncrDoclist = atoi(&zVal[21]);
    rc = SQLITE_OK;
#endif
  }else{
    rc = SQLITE_ERROR;
  }

  return rc;
}